

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O0

int KINBBDPrecGetWorkSpace(void *kinmem,long *lenrwBBDP,long *leniwBBDP)

{
  long lVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  KINMem in_RDI;
  KBBDPrecData pdata;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x133,"KINBBDPrecGetWorkSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,"KINSOL Memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->kin_lmem == (void *)0x0) {
    KINProcessError(in_RDI,-2,0x13b,"KINBBDPrecGetWorkSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,
                    "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                   );
    local_4 = -2;
  }
  else if (*(long *)((long)in_RDI->kin_lmem + 0x90) == 0) {
    KINProcessError(in_RDI,-5,0x143,"KINBBDPrecGetWorkSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,"BBD peconditioner memory is NULL. IDABBDPrecInit must be called.");
    local_4 = -5;
  }
  else {
    lVar1 = *(long *)((long)in_RDI->kin_lmem + 0x90);
    *in_RSI = *(undefined8 *)(lVar1 + 0x78);
    *in_RDX = *(undefined8 *)(lVar1 + 0x80);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINBBDPrecGetWorkSpace(void* kinmem, long int* lenrwBBDP, long int* leniwBBDP)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (KINLS_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  if (kin_mem->kin_lmem == NULL)
  {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  if (kinls_mem->pdata == NULL)
  {
    KINProcessError(kin_mem, KINLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_PMEM_NULL);
    return (KINLS_PMEM_NULL);
  }
  pdata = (KBBDPrecData)kinls_mem->pdata;

  *lenrwBBDP = pdata->rpwsize;
  *leniwBBDP = pdata->ipwsize;

  return (KINLS_SUCCESS);
}